

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O0

void __thiscall
amrex::SplineDistFcnElement2d::set_control_points
          (SplineDistFcnElement2d *this,
          vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *pts)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *this_00;
  value_type_conflict1 *in_RDI;
  RealVect *pt;
  iterator __end1;
  iterator __begin1;
  vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *__range1;
  vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<amrex::RealVect_*,_std::vector<amrex::RealVect,_std::allocator<amrex::RealVect>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<amrex::RealVect_*,_std::vector<amrex::RealVect,_std::allocator<amrex::RealVect>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (RealVect *)
       std::vector<amrex::RealVect,_std::allocator<amrex::RealVect>_>::begin
                 (in_stack_ffffffffffffffb8);
  std::vector<amrex::RealVect,_std::allocator<amrex::RealVect>_>::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffc0,
                       (__normal_iterator<amrex::RealVect_*,_std::vector<amrex::RealVect,_std::allocator<amrex::RealVect>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    this_00 = (vector<double,_std::allocator<double>_> *)
              __gnu_cxx::
              __normal_iterator<amrex::RealVect_*,_std::vector<amrex::RealVect,_std::allocator<amrex::RealVect>_>_>
              ::operator*(local_20);
    in_stack_ffffffffffffffb8 =
         (vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *)(in_RDI + 1);
    RealVect::operator[]((RealVect *)this_00,0);
    std::vector<double,_std::allocator<double>_>::push_back(this_00,in_RDI);
    in_stack_ffffffffffffffc0 =
         (__normal_iterator<amrex::RealVect_*,_std::vector<amrex::RealVect,_std::allocator<amrex::RealVect>_>_>
          *)(in_RDI + 4);
    RealVect::operator[]((RealVect *)this_00,1);
    std::vector<double,_std::allocator<double>_>::push_back(this_00,in_RDI);
    __gnu_cxx::
    __normal_iterator<amrex::RealVect_*,_std::vector<amrex::RealVect,_std::allocator<amrex::RealVect>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void SplineDistFcnElement2d::set_control_points
(std::vector<amrex::RealVect> pts) {
  for (auto & pt : pts) {
    control_points_x.push_back(pt[0]);
    control_points_y.push_back(pt[1]);
    //  std::cout << "Added point (" << pt[0] << "," << pt[1] << ")" << std::endl;
  }
}